

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coverage.cpp
# Opt level: O0

void __thiscall Coverage_generator_Test::~Coverage_generator_Test(Coverage_generator_Test *this)

{
  Coverage_generator_Test *this_local;
  
  ~Coverage_generator_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Coverage, generator)
{
    static const std::string EMPTY_STRING;

    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("coverage/generator/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto analyser = libcellml::Analyser::create();

    analyser->analyseModel(model);

    EXPECT_EQ(size_t(0), analyser->errorCount());

    auto analyserModel = analyser->model();

    EXPECT_EQ(libcellml::AnalyserModel::Type::DAE, analyserModel->type());
    EXPECT_EQ("dae", libcellml::AnalyserModel::typeAsString(analyserModel->type()));

    EXPECT_EQ(size_t(1), analyserModel->stateCount());
    EXPECT_EQ(size_t(209), analyserModel->variableCount());
    EXPECT_EQ(size_t(203), analyserModel->equationCount());

    EXPECT_NE(nullptr, analyserModel->voi());
    EXPECT_EQ(size_t(0), analyserModel->voi()->equationCount());
    EXPECT_EQ(size_t(0), analyserModel->voi()->equations().size());
    EXPECT_EQ(nullptr, analyserModel->voi()->equation(0));
    EXPECT_NE(nullptr, analyserModel->state(0));
    EXPECT_NE(size_t(0), analyserModel->state(0)->equationCount());
    EXPECT_NE(size_t(0), analyserModel->state(0)->equations().size());
    EXPECT_NE(nullptr, analyserModel->state(0)->equation(0));
    EXPECT_EQ(nullptr, analyserModel->state(analyserModel->stateCount()));
    EXPECT_NE(nullptr, analyserModel->variable(0));
    EXPECT_EQ(nullptr, analyserModel->variable(analyserModel->variableCount()));
    EXPECT_NE(nullptr, analyserModel->equation(199));
    EXPECT_NE(size_t(0), analyserModel->equation(199)->dependencyCount());
    EXPECT_NE(size_t(0), analyserModel->equation(199)->dependencies().size());
    EXPECT_NE(nullptr, analyserModel->equation(199)->dependency(0));
    EXPECT_EQ(nullptr, analyserModel->equation(199)->dependency(analyserModel->equation(199)->dependencyCount()));
    EXPECT_EQ(size_t(1), analyserModel->equation(199)->nlaSiblingCount());
    EXPECT_EQ(size_t(1), analyserModel->equation(199)->nlaSiblings().size());
    EXPECT_NE(nullptr, analyserModel->equation(199)->nlaSibling(0));
    EXPECT_EQ(nullptr, analyserModel->equation(199)->nlaSibling(analyserModel->equation(199)->nlaSiblingCount()));
    EXPECT_NE(size_t(0), analyserModel->equation(199)->variableCount());
    EXPECT_NE(size_t(0), analyserModel->equation(199)->variables().size());
    EXPECT_NE(nullptr, analyserModel->equation(199)->variable(0));
    EXPECT_EQ(nullptr, analyserModel->equation(199)->variable(analyserModel->equation(199)->variableCount()));
    EXPECT_EQ(nullptr, analyserModel->equation(analyserModel->equationCount()));

    for (const auto &equation : analyserModel->equations()) {
        checkAstTypeAsString(equation->ast());
    }

    auto generator = libcellml::Generator::create();

    EXPECT_EQ(nullptr, analyserModel->voi()->initialisingVariable());

    for (size_t i = 0; i < analyserModel->stateCount(); ++i) {
        EXPECT_NE(nullptr, analyserModel->state(i)->initialisingVariable());
    }

    std::vector<size_t> nonNull = {0, 1, 5, 17, 178, 179, 181, 205, 206};
    for (size_t i = 0; i < analyserModel->variableCount(); ++i) {
        if (std::find(nonNull.begin(), nonNull.end(), i) != nonNull.end()) {
            EXPECT_TRUE(analyserModel->variable(i)->initialisingVariable() != nullptr);
        }
    }

    EXPECT_EQ(nullptr, generator->model());
    EXPECT_EQ(EMPTY_STRING, generator->interfaceCode());
    EXPECT_EQ(EMPTY_STRING, generator->implementationCode());

    generator->setModel(analyserModel);

    EXPECT_EQ(analyserModel, generator->model());
    EXPECT_EQ(fileContents("coverage/generator/model.h"), generator->interfaceCode());
    EXPECT_EQ(fileContents("coverage/generator/model.c"), generator->implementationCode());

    auto profile = generator->profile();

    profile->setInterfaceCreateStatesArrayMethodString("double * createStatesVector();\n");
    profile->setImplementationCreateStatesArrayMethodString("double * createStatesVector()\n"
                                                            "{\n"
                                                            "    double *res = (double *) malloc(STATE_COUNT*sizeof(double));\n"
                                                            "\n"
                                                            "    for (size_t i = 0; i < STATE_COUNT; ++i) {\n"
                                                            "        res[i] = NAN;\n"
                                                            "    }\n"
                                                            "\n"
                                                            "    return res;\n"
                                                            "}\n");

    EXPECT_EQ(fileContents("coverage/generator/model.modified.profile.h"), generator->interfaceCode());
    EXPECT_EQ(fileContents("coverage/generator/model.modified.profile.c"), generator->implementationCode());

    profile = libcellml::GeneratorProfile::create();

    generator->setProfile(profile);

    profile->setHasInterface(false);

    profile->setXorString("^");
    profile->setHasXorOperator(true);

    profile->setPowerString("^^");
    profile->setSquareString("sqr");
    profile->setHasPowerOperator(true);

    profile->setPiecewiseIfString("piecewise([CONDITION], [IF_STATEMENT]");
    profile->setPiecewiseElseString(", [ELSE_STATEMENT])");
    profile->setHasConditionalOperator(false);

    profile->setInterfaceFileNameString("customheaderfile.h");

    profile->setImplementationHeaderString("#include \"[INTERFACE_FILE_NAME]\"\n");

    profile->setImplementationVersionString("");

    profile->setImplementationLibcellmlVersionString("");

    profile->setImplementationStateCountString("");

    profile->setImplementationVariableCountString("");

    profile->setVariableTypeObjectString(false, false, "");
    profile->setVariableTypeObjectString(false, true, "");
    profile->setVariableTypeObjectString(true, false, "");
    profile->setVariableTypeObjectString(true, true, "");

    profile->setVariableOfIntegrationVariableTypeString("");
    profile->setStateVariableTypeString("");
    profile->setConstantVariableTypeString("");
    profile->setComputedConstantVariableTypeString("");
    profile->setAlgebraicVariableTypeString("");
    profile->setExternalVariableTypeString("");

    profile->setVariableInfoObjectString("");

    profile->setImplementationVoiInfoString("");

    profile->setImplementationStateInfoString("");

    profile->setImplementationVariableInfoString("");

    profile->setVariableInfoEntryString("");

    profile->setImplementationCreateStatesArrayMethodString("");

    profile->setImplementationCreateVariablesArrayMethodString("");

    profile->setImplementationDeleteArrayMethodString("");

    profile->setImplementationComputeVariablesMethodString(false, false, "");
    profile->setImplementationComputeVariablesMethodString(false, true, "");
    profile->setImplementationComputeVariablesMethodString(true, false, "");
    profile->setImplementationComputeVariablesMethodString(true, true, "");

    EXPECT_EQ(EMPTY_STRING, generator->interfaceCode());
    EXPECT_EQ(fileContents("coverage/generator/model.out"), generator->implementationCode());

    profile = libcellml::GeneratorProfile::create();

    generator->setProfile(profile);

    profile->setHasInterface(true);

    profile->setEqString("eq");
    profile->setNeqString("neq");
    profile->setLtString("lt");
    profile->setLeqString("leq");
    profile->setGtString("gt");
    profile->setGeqString("geq");
    profile->setAndString("and");
    profile->setOrString("or");
    profile->setNotString("not");

    profile->setHasEqOperator(false);
    profile->setHasNeqOperator(false);
    profile->setHasLtOperator(false);
    profile->setHasLeqOperator(false);
    profile->setHasGtOperator(false);
    profile->setHasGeqOperator(false);
    profile->setHasAndOperator(false);
    profile->setHasOrOperator(false);
    profile->setHasNotOperator(false);

    profile->setImplementationHeaderString("");

    profile->setInterfaceVersionString("");
    profile->setImplementationVersionString("");

    profile->setInterfaceLibcellmlVersionString("");
    profile->setImplementationLibcellmlVersionString("");

    profile->setInterfaceStateCountString("");
    profile->setImplementationStateCountString("");

    profile->setInterfaceVariableCountString("");
    profile->setImplementationVariableCountString("");

    profile->setVariableTypeObjectString(false, false, "");
    profile->setVariableTypeObjectString(false, true, "");
    profile->setVariableTypeObjectString(true, false, "");
    profile->setVariableTypeObjectString(true, true, "");

    profile->setVariableOfIntegrationVariableTypeString("");
    profile->setStateVariableTypeString("");
    profile->setConstantVariableTypeString("");
    profile->setComputedConstantVariableTypeString("");
    profile->setAlgebraicVariableTypeString("");
    profile->setExternalVariableTypeString("");

    profile->setVariableInfoObjectString("");

    profile->setInterfaceVoiInfoString("");
    profile->setImplementationVoiInfoString("");

    profile->setInterfaceStateInfoString("");
    profile->setImplementationStateInfoString("");

    profile->setInterfaceVariableInfoString("");
    profile->setImplementationVariableInfoString("");

    profile->setVariableInfoEntryString("");

    EXPECT_EQ(fileContents("coverage/generator/model.interface.out"), generator->interfaceCode());
    EXPECT_EQ(fileContents("coverage/generator/model.implementation.out"), generator->implementationCode());

    profile->setProfile(libcellml::GeneratorProfile::Profile::PYTHON);

    EXPECT_EQ(EMPTY_STRING, generator->interfaceCode());
    EXPECT_EQ(fileContents("coverage/generator/model.py"), generator->implementationCode());

    profile->setImplementationCreateStatesArrayMethodString("\n"
                                                            "def create_states_vector():\n"
                                                            "    return [nan]*STATE_COUNT\n");

    EXPECT_EQ(EMPTY_STRING, generator->interfaceCode());
    EXPECT_EQ(fileContents("coverage/generator/model.modified.profile.py"), generator->implementationCode());

    // Coverage for the case where mProfile is equal to nullptr in Generator.

    generator->setProfile(nullptr);

    generator->interfaceCode();
    generator->implementationCode();

    // Coverage for various profile settings.

    analyser->addExternalVariable(libcellml::AnalyserExternalVariable::create(model->component("my_component")->variable("eqnEq")));

    analyser->analyseModel(model);

    generator->setModel(analyser->model());
    generator->setProfile(profile);

    profile->setAcotFunctionString("");
    profile->setAcothFunctionString("");
    profile->setAcscFunctionString("");
    profile->setAcschFunctionString("");
    profile->setAsecFunctionString("");
    profile->setAsechFunctionString("");
    profile->setCommentString("");
    profile->setCotFunctionString("");
    profile->setCothFunctionString("");
    profile->setCscFunctionString("");
    profile->setCschFunctionString("");
    profile->setExternalVariableMethodTypeDefinitionString(true, "");
    profile->setHasConditionalOperator(true);
    profile->setHasInterface(true);
    profile->setHasPowerOperator(true);
    profile->setHasXorOperator(true);
    profile->setImplementationComputeComputedConstantsMethodString("");
    profile->setImplementationComputeRatesMethodString(true, "");
    profile->setImplementationHeaderString("[INTERFACE_FILE_NAME]");
    profile->setImplementationInitialiseVariablesMethodString(true, true, "");
    profile->setInterfaceFileNameString("");
    profile->setInterfaceHeaderString("");
    profile->setMaxFunctionString("");
    profile->setMinFunctionString("");
    profile->setObjectiveFunctionMethodString(false, "");
    profile->setObjectiveFunctionMethodString(true, "");
    profile->setSecFunctionString("");
    profile->setSechFunctionString("");
    profile->setVariableInfoEntryString("");

    generator->interfaceCode();
    generator->implementationCode();

    profile->setArrayElementSeparatorString("");
    profile->setCommentString("xxx");
    profile->setFindRootMethodString(false, "");
    profile->setFindRootMethodString(true, "");
    profile->setObjectiveFunctionMethodString(false, "xxx");
    profile->setObjectiveFunctionMethodString(true, "xxx");
    profile->setOriginCommentString("");
    profile->setVariableInfoEntryString("xxx");

    generator->implementationCode();

    profile->setArrayElementSeparatorString("xxx");
    profile->setExternNlaSolveMethodString("");
    profile->setFindRootMethodString(false, "xxx");
    profile->setFindRootMethodString(true, "xxx");
    profile->setFindRootCallString(false, "");
    profile->setFindRootCallString(true, "");
    profile->setNlaSolveCallString(false, "");
    profile->setNlaSolveCallString(true, "");
    profile->setVariableOfIntegrationVariableTypeString("");

    generator->implementationCode();

    profile->setStateVariableTypeString("");
    profile->setVariableOfIntegrationVariableTypeString("xxx");

    generator->implementationCode();

    profile->setConstantVariableTypeString("");
    profile->setStateVariableTypeString("xxx");

    generator->implementationCode();

    profile->setComputedConstantVariableTypeString("");
    profile->setConstantVariableTypeString("xxx");

    generator->implementationCode();

    profile->setComputedConstantVariableTypeString("xxx");
    profile->setAlgebraicVariableTypeString("");

    generator->implementationCode();

    profile->setAlgebraicVariableTypeString("xxx");
    profile->setExternalVariableTypeString("");

    generator->implementationCode();

    profile->setHasXorOperator(false);
    profile->setXorFunctionString("");

    generator->implementationCode();

    libcellml::Generator::equationCode(analyser->model()->equation(0)->ast());
}